

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_le_mipsel(float128 a,float128 b,float_status *status)

{
  flag fVar1;
  flag fVar2;
  byte bVar3;
  int32_t iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t b0;
  uint64_t b1;
  ulong a0;
  uint64_t a1;
  undefined4 local_58;
  undefined1 local_51;
  flag bSign;
  flag aSign;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  b0 = b.high;
  b1 = b.low;
  a0 = a.high;
  a1 = a.low;
  iVar4 = extractFloat128Exp(a);
  if (iVar4 == 0x7fff) {
    uVar5 = extractFloat128Frac0(a);
    uVar6 = extractFloat128Frac1(a);
    if (uVar5 == 0 && uVar6 == 0) goto LAB_00a29cde;
LAB_00a29d20:
    float_raise_mipsel('\x01',status);
    a_local.high._4_4_ = 0;
  }
  else {
LAB_00a29cde:
    iVar4 = extractFloat128Exp(b);
    if (iVar4 == 0x7fff) {
      uVar5 = extractFloat128Frac0(b);
      uVar6 = extractFloat128Frac1(b);
      if (uVar5 != 0 || uVar6 != 0) goto LAB_00a29d20;
    }
    fVar1 = extractFloat128Sign(a);
    fVar2 = extractFloat128Sign(b);
    if (fVar1 == fVar2) {
      if (fVar1 == '\0') {
        bVar3 = le128(a0,a1,b0,b1);
      }
      else {
        bVar3 = le128(b0,b1,a0,a1);
      }
      local_58 = (uint)bVar3;
      a_local.high._4_4_ = local_58;
    }
    else {
      local_51 = true;
      if (fVar1 == '\0') {
        local_51 = (((a0 | b0) & 0x7fffffffffffffff) == 0 && a1 == 0) && b1 == 0;
      }
      a_local.high._4_4_ = (uint)local_51;
    }
  }
  return a_local.high._4_4_;
}

Assistant:

int float128_le(float128 a, float128 b, float_status *status)
{
    flag aSign, bSign;

    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 0;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        return
               aSign
            || (    ( ( (uint64_t) ( ( a.high | b.high )<<1 ) ) | a.low | b.low )
                 == 0 );
    }
    return
          aSign ? le128( b.high, b.low, a.high, a.low )
        : le128( a.high, a.low, b.high, b.low );

}